

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_trainer.cpp
# Opt level: O2

void __thiscall
Am_Gesture_Trainer_Data::Am_Gesture_Trainer_Data
          (Am_Gesture_Trainer_Data *this,Am_Gesture_Trainer_Data *d)

{
  Gesture_Class *this_00;
  Gesture_Class *this_01;
  Gesture_Class *pGVar1;
  
  (this->super_Am_Wrapper).refs = 1;
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002ea488;
  Am_Gesture_Classifier::Am_Gesture_Classifier(&this->cached_classifier);
  pGVar1 = d->head;
  if (pGVar1 == (Gesture_Class *)0x0) {
    this->head = (Gesture_Class *)0x0;
    this->tail = (Gesture_Class *)0x0;
  }
  else {
    this_00 = (Gesture_Class *)operator_new(0x28);
    Gesture_Class::Gesture_Class(this_00,pGVar1);
    this->head = this_00;
    this_00->prev = (Gesture_Class *)0x0;
    pGVar1 = d->head;
    while (pGVar1 = pGVar1->next, pGVar1 != (Gesture_Class *)0x0) {
      this_01 = (Gesture_Class *)operator_new(0x28);
      Gesture_Class::Gesture_Class(this_01,pGVar1);
      this_00->next = this_01;
      this_01->prev = this_00;
      this_00 = this_01;
    }
    this_00->next = (Gesture_Class *)0x0;
    this->tail = this_00;
  }
  this->nclasses = d->nclasses;
  Am_Gesture_Classifier::operator=(&this->cached_classifier,&d->cached_classifier);
  return;
}

Assistant:

Am_Gesture_Trainer_Data::Am_Gesture_Trainer_Data(Am_Gesture_Trainer_Data *d)
{
  if (d->head == nullptr)
    head = tail = nullptr;
  else {
    Gesture_Class *from, *to, *last;

    head = new Gesture_Class(d->head);
    head->prev = nullptr;
    for (last = head, from = d->head->next; from != nullptr;
         last = to, from = from->next) {
      to = new Gesture_Class(from);
      last->next = to;
      to->prev = last;
    }
    last->next = nullptr;
    tail = last;
  }

  nclasses = d->nclasses;
  cached_classifier = d->cached_classifier;
}